

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movegen.h
# Opt level: O0

vector<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_> *
puppup::movegen::genFromBoard
          (vector<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>
           *__return_storage_ptr__,Gaddag *gaddag,byte param_3)

{
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  const_iterator piVar4;
  long lVar5;
  nodeid node;
  idx extraout_RDX;
  idx extraout_RDX_00;
  idx extraout_RDX_01;
  idx extraout_RDX_02;
  idx extraout_RDX_03;
  idx x;
  State *pSVar6;
  idx *piVar7;
  byte bVar8;
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  idx aiStack_22328 [514];
  Gaddag *pGStack_21318;
  idx iStack_21310;
  size_type sStack_21308;
  undefined1 *puStack_21300;
  undefined1 *puStack_212f8;
  bool bStack_212ea;
  undefined1 uStack_212e9;
  vector<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_> *pvStack_212e8;
  vector<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_> *pvStack_212e0;
  State *pSStack_212d8;
  Rack *pRStack_212d0;
  undefined4 uStack_212c4;
  State SStack_212c0;
  undefined1 auStack_202b8 [64];
  undefined1 auStack_20278 [64];
  undefined1 auStack_20238 [64];
  undefined1 auStack_201f8 [64];
  size_type sStack_201b0;
  idx j;
  size_type sStack_201a0;
  bool needs_both_directions;
  idx i_2;
  undefined1 auStack_20188 [8];
  array<long,_16384UL> orthogonal_memo;
  idx step;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<int> local_168;
  initializer_list<int> *local_158;
  initializer_list<int> *__range2;
  idx n_buildable;
  vector<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_> outputs;
  idx i_1;
  idx i;
  array<bool,_256UL> buildable;
  bool best_only_local;
  Gaddag *gaddag_local;
  
  bVar8 = 0;
  pSStack_212d8 = (State *)&stack0x00000108;
  pRStack_212d0 = (Rack *)&stack0x00000008;
  buildable._M_elems[0xf8] = (bool)(param_3 & 1);
  i._6_1_ = 0;
  pvStack_212e8 = __return_storage_ptr__;
  pvStack_212e0 = __return_storage_ptr__;
  unique0x1000086b = gaddag;
  std::array<bool,_256UL>::fill
            ((array<bool,_256UL> *)((long)&i + 7),(value_type_conflict *)((long)&i + 6));
  for (i_1 = 0; i_1 < 0xf0; i_1 = i_1 + 1) {
    pvVar2 = std::array<long,_256UL>::operator[](&pSStack_212d8->board,i_1);
    if (*pvVar2 != 0x1b) {
      pvVar3 = std::array<bool,_256UL>::operator[]((array<bool,_256UL> *)((long)&i + 7),i_1 - 0x10);
      *pvVar3 = true;
      pvVar3 = std::array<bool,_256UL>::operator[]((array<bool,_256UL> *)((long)&i + 7),i_1 + 0x10);
      *pvVar3 = true;
      pvVar3 = std::array<bool,_256UL>::operator[]((array<bool,_256UL> *)((long)&i + 7),i_1 - 1);
      *pvVar3 = true;
      pvVar3 = std::array<bool,_256UL>::operator[]((array<bool,_256UL> *)((long)&i + 7),i_1 + 1);
      *pvVar3 = true;
    }
  }
  for (outputs.super__Vector_base<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (long)outputs.
            super__Vector_base<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage < 0xf0;
      outputs.super__Vector_base<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)&(outputs.
                             super__Vector_base<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->score + 1)) {
    pvVar2 = std::array<long,_256UL>::operator[]
                       (&pSStack_212d8->board,
                        (size_type)
                        outputs.
                        super__Vector_base<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if ((*pvVar2 != 0x1b) ||
       (bVar1 = __impl::edge((idx)outputs.
                                  super__Vector_base<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage), bVar1)) {
      pvVar3 = std::array<bool,_256UL>::operator[]
                         ((array<bool,_256UL> *)((long)&i + 7),
                          (size_type)
                          outputs.
                          super__Vector_base<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      *pvVar3 = false;
    }
  }
  std::vector<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>::vector
            ((vector<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_> *)&n_buildable);
  __range2 = (initializer_list<int> *)0x0;
  __begin2._0_4_ = 1;
  __begin2._4_4_ = 0x10;
  local_168._M_array = (iterator)&__begin2;
  local_168._M_len = 2;
  local_158 = &local_168;
  __end2 = std::initializer_list<int>::begin(local_158);
  piVar4 = std::initializer_list<int>::end(local_158);
  x = extraout_RDX;
  do {
    if (__end2 == piVar4) {
      if (__range2 == (initializer_list<int> *)0x0) {
        auVar9 = vmovdqu64_avx512f(*(undefined1 (*) [64])pRStack_212d0->_M_elems);
        auVar10 = vmovdqu64_avx512f(*(undefined1 (*) [64])(pRStack_212d0->_M_elems + 8));
        auVar11 = vmovdqu64_avx512f(*(undefined1 (*) [64])(pRStack_212d0->_M_elems + 0x10));
        auVar12 = vmovdqu64_avx512f(*(undefined1 (*) [64])(pRStack_212d0->_M_elems + 0x18));
        auStack_201f8 = vmovdqu64_avx512f(auVar12);
        auStack_20238 = vmovdqu64_avx512f(auVar11);
        auStack_20278 = vmovdqu64_avx512f(auVar10);
        auStack_202b8 = vmovdqu64_avx512f(auVar9);
        pGStack_21318 = stack0xffffffffffffffe8;
        board::State::State(&SStack_212c0);
        pSVar6 = &SStack_212c0;
        piVar7 = aiStack_22328;
        for (lVar5 = 0x201; lVar5 != 0; lVar5 = lVar5 + -1) {
          *piVar7 = pSVar6->score;
          pSVar6 = (State *)((long)pSVar6 + ((ulong)bVar8 * -2 + 1) * 8);
          piVar7 = piVar7 + (ulong)bVar8 * -2 + 1;
        }
        auVar9 = vmovdqu64_avx512f(auStack_202b8);
        auVar10 = vmovdqu64_avx512f(auStack_20278);
        auVar11 = vmovdqu64_avx512f(auStack_20238);
        auVar12 = vmovdqu64_avx512f(auStack_201f8);
        vmovdqu64_avx512f(auVar12);
        vmovdqu64_avx512f(auVar11);
        vmovdqu64_avx512f(auVar10);
        vmovdqu64_avx512f(auVar9);
        genFromIdx(pvStack_212e8,pGStack_21318,0x77,0);
      }
      else {
        std::vector<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>::vector
                  (pvStack_212e8,
                   (vector<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_> *)
                   &n_buildable);
      }
      uStack_212c4 = 1;
      std::vector<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>::~vector
                ((vector<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_> *)
                 &n_buildable);
      return pvStack_212e0;
    }
    lVar5 = (long)*__end2;
    constArray<16384l>((array<long,_16384UL> *)auStack_20188,(puppup *)0xfffffffffffffffe,x);
    x = extraout_RDX_00;
    for (sStack_201a0 = 0; (long)sStack_201a0 < 0xf0; sStack_201a0 = sStack_201a0 + 1) {
      pvVar3 = std::array<bool,_256UL>::operator[]
                         ((array<bool,_256UL> *)((long)&i + 7),sStack_201a0);
      x = extraout_RDX_01;
      if ((*pvVar3 & 1U) != 0) {
        j._7_1_ = 0;
        pvVar3 = std::array<bool,_256UL>::operator[]
                           ((array<bool,_256UL> *)((long)&i + 7),sStack_201a0 - lVar5);
        if ((*pvVar3 & 1U) == 0) {
          j._7_1_ = 1;
          sStack_201b0 = sStack_201a0 - lVar5;
          while( true ) {
            uStack_212e9 = __impl::edge(sStack_201b0);
            bStack_212ea = false;
            if (!(bool)uStack_212e9) {
              pvVar2 = std::array<long,_256UL>::operator[](&pSStack_212d8->board,sStack_201b0);
              bStack_212ea = *pvVar2 != 0x1b;
            }
            if (bStack_212ea == false) goto LAB_00121517;
            pvVar3 = std::array<bool,_256UL>::operator[]
                               ((array<bool,_256UL> *)((long)&i + 7),sStack_201b0);
            if ((*pvVar3 & 1U) != 0) break;
            sStack_201b0 = sStack_201b0 - lVar5;
          }
          j._7_1_ = 0;
        }
LAB_00121517:
        if ((j._7_1_ & 1) == 0) {
          sStack_21308 = sStack_201a0;
          iStack_21310 = lVar5;
          node = trie::Gaddag::get(stack0xffffffffffffffe8,0,0x1f);
          puStack_21300 = &stack0xfffffffffffddbd8;
          __impl::gen(pRStack_212d0,iStack_21310,sStack_21308,sStack_21308,node,
                      stack0xffffffffffffffe8,pSStack_212d8,0,0,1,
                      (vector<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_> *)
                      &n_buildable,(bool)(buildable._M_elems[0xf8] & 1),
                      (array<long,_16384UL> *)auStack_20188,0,0);
          x = extraout_RDX_03;
        }
        else {
          puStack_212f8 = &stack0xfffffffffffddbd8;
          __impl::gen(pRStack_212d0,-lVar5,sStack_201a0,sStack_201a0,0,stack0xffffffffffffffe8,
                      pSStack_212d8,0,0,1,
                      (vector<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_> *)
                      &n_buildable,(bool)(buildable._M_elems[0xf8] & 1),
                      (array<long,_16384UL> *)auStack_20188,0,0);
          x = extraout_RDX_02;
        }
        __range2 = (initializer_list<int> *)((long)&__range2->_M_array + 1);
      }
    }
    __end2 = __end2 + 1;
  } while( true );
}

Assistant:

inline std::vector<Move> genFromBoard(Rack r, const trie::Gaddag& gaddag,
                                      board::State state,
                                      const bool best_only = false) {
    std::array<bool, 256> buildable;
    buildable.fill(false);
    for (idx i = 0; i < 240; ++i) {
        if (state.board[i] != emptiness) {
            buildable[i - 16] = true;
            buildable[i + 16] = true;
            buildable[i - 1] = true;
            buildable[i + 1] = true;
        }
    }
    for (idx i = 0; i < 240; ++i) {
        if (state.board[i] != emptiness || __impl::edge(i)) {
            buildable[i] = false;
        }
    }

    std::vector<Move> outputs;
    idx n_buildable = 0;
    for (idx step : {1, 16}) {
        auto orthogonal_memo = constArray<256 * 32 * 2>(-2);
        for (idx i = 0; i < 240; ++i) {
            if (buildable[i]) {
                bool needs_both_directions = false;
                // todo: faster method than this ridiculous O(n^3) one
                if (!buildable[i - step]) {
                    needs_both_directions = true;
                    idx j = i - step;
                    while (!__impl::edge(j) && state.board[j] != emptiness) {
                        if (buildable[j]) {
                            needs_both_directions = false;
                            break;
                        }
                        j -= step;
                    }
                }
                // if (step == 1) std::cerr << "left ";
                // if (step == 16) std::cerr << "down ";
                if (needs_both_directions) {
                    // std::cerr << "generating from " << i / 16 << ", " << i %
                    // 16
                    // << " with both directions" << std::endl;
                    __impl::gen(r, -step, i, i, 0, gaddag, state, 0, 0, 1,
                                outputs, best_only, orthogonal_memo);
                } else {
                    // std::cerr << "generating from " << i / 16 << ", " << i %
                    // 16
                    // << " in forward directions" << std::endl;
                    __impl::gen(r, step, i, i, gaddag.get(0, trie::rev_marker),
                                gaddag, state, 0, 0, 1, outputs, best_only,
                                orthogonal_memo);
                }
                ++n_buildable;
            }
        }
    }
    if (!n_buildable) {
        return genFromIdx(r, gaddag);
    }
    // std::cerr << "outputs: " << outputs.size() << std::endl;
    return outputs;
}